

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bac.h
# Opt level: O3

int Bac_ObjDup(Bac_Ntk_t *pNew,Bac_Ntk_t *p,int i)

{
  uint i_00;
  int iVar1;
  int iVar2;
  Bac_ObjType_t Type;
  
  if ((i < 0) || ((p->vType).nSize <= i)) {
LAB_008bff7c:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                  ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
  }
  Type = (Bac_ObjType_t)((byte)(p->vType).pArray[(uint)i] >> 1);
  iVar1 = -1;
  if (0xffffffbb < Type - BAC_BOX_UNKNOWN) {
    if ((p->vFanin).nSize <= i) goto LAB_008bff9b;
    iVar1 = (p->vFanin).pArray[(uint)i];
  }
  i_00 = Bac_ObjAlloc(pNew,Type,iVar1);
  if (((p->vName).pArray != (int *)0x0) && ((pNew->vName).pArray != (int *)0x0)) {
    if ((p->vType).nSize <= i) goto LAB_008bff7c;
    if (((p->vType).pArray[(uint)i] & 0xfcU) != 4) {
      iVar1 = Bac_ObjName(p,i);
      iVar2 = Bac_ObjName(pNew,i_00);
      if (iVar2 != 0) {
LAB_008bfff8:
        __assert_fail("Bac_ObjName(p, i) == 0 && !Bac_ObjIsCo(p, i)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                      ,300,"void Bac_ObjSetName(Bac_Ntk_t *, int, int)");
      }
      if (((int)i_00 < 0) || ((pNew->vType).nSize <= (int)i_00)) goto LAB_008bff7c;
      if (((pNew->vType).pArray[i_00] & 0xfcU) == 4) goto LAB_008bfff8;
      Vec_IntFillExtra(&pNew->vName,i_00 + 1,0);
      if ((pNew->vName).nSize <= (int)i_00) goto LAB_008bffba;
      (pNew->vName).pArray[i_00] = iVar1;
    }
  }
  if ((p->vCopy).nSize <= i) {
LAB_008bff9b:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  if ((p->vCopy).pArray[(uint)i] != -1) {
    __assert_fail("Bac_ObjCopy(p, i) == -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                  ,0x12d,"void Bac_ObjSetCopy(Bac_Ntk_t *, int, int)");
  }
  Vec_IntFillExtra(&p->vCopy,i + 1,0);
  if (i < (p->vCopy).nSize) {
    (p->vCopy).pArray[(uint)i] = i_00;
    return i_00;
  }
LAB_008bffba:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
}

Assistant:

static inline int Bac_ObjDup( Bac_Ntk_t * pNew, Bac_Ntk_t * p, int i )
{
    int iObj = Bac_ObjAlloc( pNew, Bac_ObjType(p, i), Bac_ObjIsBox(p, i) ? Bac_BoxNtkId(p, i) : -1 );
    if ( Bac_NtkHasNames(p) && Bac_NtkHasNames(pNew) && !Bac_ObjIsCo(p, i) ) 
        Bac_ObjSetName( pNew, iObj, Bac_ObjName(p, i) );
    Bac_ObjSetCopy( p, i, iObj );
    return iObj;
}